

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

int Abc_NtkCountAndNodes(Vec_Ptr_t *vOrder)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkModel;
  Gia_Man_t *pGiaBox;
  Vec_Ptr_t *vOrder_local;
  
  local_30 = 0;
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(vOrder);
    if (iVar1 <= local_2c) {
      return local_30;
    }
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vOrder,local_2c);
    iVar1 = Abc_ObjIsNode(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsBox(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                      ,0x139,"int Abc_NtkCountAndNodes(Vec_Ptr_t *)");
      }
      iVar1 = Gia_ManAndNum(*(Gia_Man_t **)((long)(pObj_00->field_5).pData + 0x158));
      local_30 = iVar1 + local_30;
    }
    else {
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Abc_NtkCountAndNodes( Vec_Ptr_t * vOrder )
{
    Gia_Man_t * pGiaBox;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            Counter++;
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        pGiaBox   = (Gia_Man_t *)pNtkModel->pData;
        Counter  += Gia_ManAndNum(pGiaBox);
    }
    return Counter;
}